

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O2

FString __thiscall level_info_t::LookupLevelName(level_info_t *this)

{
  FString *other;
  char cVar1;
  uint uVar2;
  char *__haystack;
  char *pcVar3;
  size_t sVar4;
  long in_RSI;
  char checkstring [32];
  
  other = (FString *)(in_RSI + 0x78);
  if ((*(byte *)(in_RSI + 0x67) & 4) == 0) {
    FString::AttachToOther((FString *)this,other);
    return (FString)(char *)this;
  }
  __haystack = FStringTable::operator[](&GStrings,other->Chars);
  if (__haystack == (char *)0x0) {
    __haystack = other->Chars;
    goto LAB_0045d52e;
  }
  pcVar3 = *(char **)(in_RSI + 8);
  if (*(uint *)(pcVar3 + -0xc) < 4) {
LAB_0045d509:
    checkstring[0] = '\0';
  }
  else {
    cVar1 = *pcVar3;
    if (cVar1 == 'M') {
      if ((pcVar3[1] != 'A') || (pcVar3[2] != 'P')) goto LAB_0045d4bd;
      pcVar3 = pcVar3 + 3;
    }
    else {
      if ((cVar1 == 'E') && (pcVar3[2] == 'M')) {
        mysnprintf(checkstring,0x20,"%s: ");
        goto LAB_0045d50d;
      }
LAB_0045d4bd:
      if ((((cVar1 != 'L' || *(uint *)(pcVar3 + -0xc) < 6) || (pcVar3[1] != 'E')) ||
          (pcVar3[2] != 'V')) || ((pcVar3[3] != 'E' || (pcVar3[4] != 'L')))) goto LAB_0045d509;
      pcVar3 = pcVar3 + 5;
    }
    uVar2 = atoi(pcVar3);
    mysnprintf(checkstring,0x20,"%d: ",(ulong)uVar2);
  }
LAB_0045d50d:
  pcVar3 = strstr(__haystack,checkstring);
  if (pcVar3 != (char *)0x0) {
    sVar4 = strlen(checkstring);
    __haystack = pcVar3 + sVar4;
  }
LAB_0045d52e:
  FString::FString((FString *)this,__haystack);
  return (FString)(char *)this;
}

Assistant:

FString level_info_t::LookupLevelName()
{
	if (flags & LEVEL_LOOKUPLEVELNAME)
	{
		const char *thename;
		const char *lookedup;

		lookedup = GStrings[LevelName];
		if (lookedup == NULL)
		{
			thename = LevelName;
		}
		else
		{
			char checkstring[32];

			// Strip out the header from the localized string
			if (MapName.Len() > 3 && MapName[0] == 'E' && MapName[2] == 'M')
			{
				mysnprintf (checkstring, countof(checkstring), "%s: ", MapName.GetChars());
			}
			else if (MapName.Len() > 3 && MapName[0] == 'M' && MapName[1] == 'A' && MapName[2] == 'P')
			{
				mysnprintf (checkstring, countof(checkstring), "%d: ", atoi(&MapName[3]));
			}
			else if (MapName.Len() > 5 && MapName[0] == 'L' && MapName[1] == 'E' && MapName[2] == 'V' && MapName[3] == 'E' && MapName[4] == 'L')
			{
				mysnprintf (checkstring, countof(checkstring), "%d: ", atoi(&MapName[5]));
			}
			else
			{
				// make sure nothing is stripped.
				checkstring[0] = '\0';
			}
			thename = strstr (lookedup, checkstring);
			if (thename == NULL)
			{
				thename = lookedup;
			}
			else
			{
				thename += strlen (checkstring);
			}
		}
		return thename;
	}
	else return LevelName;
}